

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_remove_from_jmp_list(TranslationBlock_conflict *orig,int n_orig)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong local_60;
  uint local_44;
  uintptr_t *puStack_40;
  int n;
  uintptr_t *pprev;
  TranslationBlock_conflict *tb;
  TranslationBlock_conflict *dest;
  uintptr_t ptr_locked;
  uintptr_t ptr;
  int n_orig_local;
  TranslationBlock_conflict *orig_local;
  
  local_60 = orig->jmp_dest[n_orig];
  do {
    LOCK();
    uVar2 = orig->jmp_dest[n_orig];
    bVar3 = local_60 == uVar2;
    if (bVar3) {
      orig->jmp_dest[n_orig] = local_60 | 1;
      uVar2 = local_60;
    }
    UNLOCK();
    local_60 = uVar2;
  } while (!bVar3);
  uVar1 = uVar2 & 0xfffffffffffffffe;
  if (uVar1 != 0) {
    if (orig->jmp_dest[n_orig] == (uVar2 | 1)) {
      puStack_40 = (uintptr_t *)(uVar1 + 0x68);
      local_44 = (uint)*(undefined8 *)(uVar1 + 0x68);
      uVar2 = *(ulong *)(uVar1 + 0x68);
      while( true ) {
        pprev = (uintptr_t *)(uVar2 & 0xfffffffffffffffe);
        local_44 = local_44 & 1;
        if (pprev == (uintptr_t *)0x0) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                     ,0x5b0,(char *)0x0);
        }
        if (((TranslationBlock_conflict *)pprev == orig) && (local_44 == n_orig)) break;
        puStack_40 = pprev + (long)(int)local_44 + 0xe;
        uVar2 = pprev[(long)(int)local_44 + 0xe];
        local_44 = (uint)uVar2;
      }
      *puStack_40 = pprev[(long)(int)local_44 + 0xe];
    }
    else if ((orig->jmp_dest[n_orig] != 1) || ((*(uint *)(uVar1 + 0x10) & 0x40000) == 0)) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                 ,0x5a0,"ptr_locked == 1 && dest->cflags & CF_INVALID");
    }
  }
  return;
}

Assistant:

static inline void tb_remove_from_jmp_list(TranslationBlock *orig, int n_orig)
{
    uintptr_t ptr, ptr_locked;
    TranslationBlock *dest;
    TranslationBlock *tb;
    uintptr_t *pprev;
    int n;

    /* mark the LSB of jmp_dest[] so that no further jumps can be inserted */
    ptr = atomic_or_fetch(&orig->jmp_dest[n_orig], 1);
    dest = (TranslationBlock *)(ptr & ~1);
    if (dest == NULL) {
        return;
    }

    ptr_locked = orig->jmp_dest[n_orig];
    if (ptr_locked != ptr) {
        /*
         * The only possibility is that the jump was unlinked via
         * tb_jump_unlink(dest). Seeing here another destination would be a bug,
         * because we set the LSB above.
         */
        g_assert(ptr_locked == 1 && dest->cflags & CF_INVALID);
        return;
    }
    /*
     * We first acquired the lock, and since the destination pointer matches,
     * we know for sure that @orig is in the jmp list.
     */
    pprev = &dest->jmp_list_head;
    TB_FOR_EACH_JMP(dest, tb, n) {
        if (tb == orig && n == n_orig) {
            *pprev = tb->jmp_list_next[n];
            /* no need to set orig->jmp_dest[n]; setting the LSB was enough */
            return;
        }
        pprev = &tb->jmp_list_next[n];
    }
    g_assert_not_reached();
}